

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_edge_offset_class1_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  char cVar1;
  char cVar2;
  uint uVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 *in_R8;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  WORD8 *pi1_sao_offset;
  int in_stack_00000030;
  WORD32 edge_idx;
  WORD32 bit_depth;
  WORD8 u1_sign_down;
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_mask [64];
  WORD32 col;
  WORD32 row;
  char local_128;
  long local_120;
  char acStack_f8 [64];
  undefined1 auStack_b8 [64];
  byte local_78 [64];
  int local_38;
  int local_34;
  undefined1 *local_28;
  long local_20;
  long local_18;
  int local_c;
  long local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0xff,0x40);
  *local_28 = *(undefined1 *)(local_20 + ((int)pi1_sao_offset + -2));
  local_28[1] = *(undefined1 *)(local_20 + ((int)pi1_sao_offset + -1));
  for (local_34 = 0; local_34 < in_stack_00000030; local_34 = local_34 + 1) {
    *(undefined1 *)(local_18 + (local_34 << 1)) =
         *(undefined1 *)(local_8 + (local_34 * local_c + (int)pi1_sao_offset + -2));
    *(undefined1 *)(local_18 + (local_34 * 2 + 1)) =
         *(undefined1 *)(local_8 + (local_34 * local_c + (int)pi1_sao_offset + -1));
  }
  for (local_38 = 0; local_38 < (int)pi1_sao_offset; local_38 = local_38 + 1) {
    auStack_b8[local_38] =
         *(undefined1 *)(local_8 + ((in_stack_00000030 + -1) * local_c + local_38));
  }
  if (*(char *)(in_stack_00000010 + 2) == '\0') {
    local_8 = local_8 + local_c;
    in_stack_00000030 = in_stack_00000030 + -1;
    for (local_38 = 0; local_38 < (int)pi1_sao_offset; local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) -
               (uint)*(byte *)(local_8 + (local_38 - local_c))) < 0) {
        cVar2 = -1;
      }
      else {
        cVar2 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_8 + (local_38 - local_c)));
      }
      acStack_f8[local_38] = cVar2;
    }
  }
  else {
    for (local_38 = 0; local_38 < (int)pi1_sao_offset; local_38 = local_38 + 1) {
      if ((int)((uint)*(byte *)(local_8 + local_38) - (uint)*(byte *)(local_20 + local_38)) < 0) {
        cVar2 = -1;
      }
      else {
        cVar2 = 0 < (int)((uint)*(byte *)(local_8 + local_38) - (uint)*(byte *)(local_20 + local_38)
                         );
      }
      acStack_f8[local_38] = cVar2;
    }
  }
  if (*(char *)(in_stack_00000010 + 3) == '\0') {
    in_stack_00000030 = in_stack_00000030 + -1;
  }
  for (local_34 = 0; local_34 < in_stack_00000030; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (int)pi1_sao_offset; local_38 = local_38 + 1) {
      if (local_38 % 2 == 0) {
        local_120 = in_stack_00000018;
      }
      else {
        local_120 = in_stack_00000020;
      }
      if ((int)((uint)*(byte *)(local_8 + local_38) -
               (uint)*(byte *)(local_8 + (local_38 + local_c))) < 0) {
        cVar2 = -1;
      }
      else {
        cVar2 = 0 < (int)((uint)*(byte *)(local_8 + local_38) -
                         (uint)*(byte *)(local_8 + (local_38 + local_c)));
      }
      cVar1 = acStack_f8[local_38];
      acStack_f8[local_38] = -cVar2;
      uVar3 = gi4_ihevc_table_edge_idx[cVar1 + 2 + (int)cVar2] & (uint)local_78[local_38 >> 1];
      if (uVar3 != 0) {
        if ((int)((uint)*(byte *)(local_8 + local_38) + (int)*(char *)(local_120 + (int)uVar3)) <
            0x100) {
          if ((int)((uint)*(byte *)(local_8 + local_38) + (int)*(char *)(local_120 + (int)uVar3)) <
              0) {
            local_128 = '\0';
          }
          else {
            local_128 = *(char *)(local_8 + local_38) + *(char *)(local_120 + (int)uVar3);
          }
        }
        else {
          local_128 = -1;
        }
        *(char *)(local_8 + local_38) = local_128;
      }
    }
    local_8 = local_8 + local_c;
  }
  for (local_38 = 0; local_38 < (int)pi1_sao_offset; local_38 = local_38 + 1) {
    *(undefined1 *)(local_20 + local_38) = auStack_b8[local_38];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class1_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    WORD8 u1_sign_down;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_CHROMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + wd - 2];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update height and source pointers based on the availability flags */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col]);
        }
    }
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + src_strd]);
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                au1_sign_up[col] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}